

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::AsyncStreamFd::AsyncStreamFd
          (AsyncStreamFd *this,UnixEventPort *eventPort,int fd,uint flags,uint observerFlags)

{
  uint observerFlags_local;
  uint flags_local;
  int fd_local;
  UnixEventPort *eventPort_local;
  AsyncStreamFd *this_local;
  
  OwnedFileDescriptor::OwnedFileDescriptor(&this->super_OwnedFileDescriptor,fd,flags);
  AsyncCapabilityStream::AsyncCapabilityStream(&this->super_AsyncCapabilityStream);
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_00c12b90;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&DAT_00c12c60;
  this->eventPort = eventPort;
  UnixEventPort::FdObserver::FdObserver(&this->observer,eventPort,fd,observerFlags);
  Maybe<kj::ForkedPromise<void>_>::Maybe(&this->writeDisconnectedPromise);
  Maybe<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>::Maybe
            (&this->ancillaryMsgCallback);
  return;
}

Assistant:

AsyncStreamFd(UnixEventPort& eventPort, int fd, uint flags, uint observerFlags)
      : OwnedFileDescriptor(fd, flags),
        eventPort(eventPort),
        observer(eventPort, fd, observerFlags) {}